

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddDefaultValue(Parse *pParse,Expr *pExpr,char *zStart,char *zEnd)

{
  Table *pTVar1;
  int iVar2;
  Column *pCVar3;
  Expr *pEVar4;
  undefined1 local_88 [8];
  Expr x;
  sqlite3 *db;
  Column *pCol;
  Table *p;
  char *zEnd_local;
  char *zStart_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  x.y = (anon_union_8_2_31fbcc88_for_y)pParse->db;
  pTVar1 = pParse->pNewTable;
  if (pTVar1 != (Table *)0x0) {
    pCVar3 = pTVar1->aCol + (pTVar1->nCol + -1);
    iVar2 = sqlite3ExprIsConstantOrFunction(pExpr,((sqlite3InitInfo *)&x.y.pTab[1].pCheck)->busy);
    if (iVar2 == 0) {
      sqlite3ErrorMsg(pParse,"default value of column [%s] is not constant",pCVar3->zName);
    }
    else {
      sqlite3ExprDelete((sqlite3 *)x.y.pTab,pCVar3->pDflt);
      memset(local_88,0,0x48);
      local_88[0] = 0xa9;
      x._0_8_ = sqlite3DbSpanDup((sqlite3 *)x.y.pTab,zStart,zEnd);
      local_88._4_4_ = 0x1000;
      x.u = (anon_union_8_2_443a03b8_for_u)pExpr;
      pEVar4 = sqlite3ExprDup((sqlite3 *)x.y.pTab,(Expr *)local_88,1);
      pCVar3->pDflt = pEVar4;
      sqlite3DbFree((sqlite3 *)x.y.pTab,(void *)x._0_8_);
    }
  }
  if (1 < pParse->eParseMode) {
    sqlite3RenameExprUnmap(pParse,pExpr);
  }
  sqlite3ExprDelete((sqlite3 *)x.y.pTab,pExpr);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddDefaultValue(
  Parse *pParse,           /* Parsing context */
  Expr *pExpr,             /* The parsed expression of the default value */
  const char *zStart,      /* Start of the default value text */
  const char *zEnd         /* First character past end of defaut value text */
){
  Table *p;
  Column *pCol;
  sqlite3 *db = pParse->db;
  p = pParse->pNewTable;
  if( p!=0 ){
    pCol = &(p->aCol[p->nCol-1]);
    if( !sqlite3ExprIsConstantOrFunction(pExpr, db->init.busy) ){
      sqlite3ErrorMsg(pParse, "default value of column [%s] is not constant",
          pCol->zName);
    }else{
      /* A copy of pExpr is used instead of the original, as pExpr contains
      ** tokens that point to volatile memory.
      */
      Expr x;
      sqlite3ExprDelete(db, pCol->pDflt);
      memset(&x, 0, sizeof(x));
      x.op = TK_SPAN;
      x.u.zToken = sqlite3DbSpanDup(db, zStart, zEnd);
      x.pLeft = pExpr;
      x.flags = EP_Skip;
      pCol->pDflt = sqlite3ExprDup(db, &x, EXPRDUP_REDUCE);
      sqlite3DbFree(db, x.u.zToken);
    }
  }
  if( IN_RENAME_OBJECT ){
    sqlite3RenameExprUnmap(pParse, pExpr);
  }
  sqlite3ExprDelete(db, pExpr);
}